

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O2

char * __thiscall VPLGrammar::Parser::FunctionDefinitionNode::GetName(FunctionDefinitionNode *this)

{
  return "FunctionDefinition";
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                out << "func " << scope->GetLastFunctionName() << '\n';
                scope->SpawnFunctionScope();
                children_[1]->BuildProgram(scope, out);
                scope->CloseScope();
                out << "    ret\n";
            }